

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

void __thiscall wasm::Wasm2JSGlue::emitMemory(Wasm2JSGlue *this)

{
  pointer puVar1;
  Module *wasm;
  char *pcVar2;
  __uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true> *p_Var3;
  bool bVar4;
  pointer puVar5;
  ostream *poVar6;
  int64_t __val;
  Global *pGVar7;
  Wasm2JSGlue *pWVar8;
  ulong uVar9;
  uint uVar10;
  Fatal local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  ostream *local_50;
  Global *local_48;
  allocator<char> local_39;
  Wasm2JSGlue *local_38;
  
  bVar4 = needsBufferView(this->wasm);
  if (bVar4) {
    std::operator<<(&this->out->out,"  var bufferView;\n");
  }
  puVar5 = (this->wasm->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->wasm->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    do {
      local_38 = this;
      if (puVar5 == puVar1) goto LAB_00d27c05;
      p_Var3 = &puVar5->_M_t;
      puVar5 = puVar5 + 1;
    } while (((p_Var3->
              super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>).
              _M_t.
              super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
              super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->isPassive != true);
    std::operator<<(&this->out->out,"  var memorySegments = {};\n");
LAB_00d27c05:
    std::operator<<(&local_38->out->out,
                    "  var base64ReverseLookup = new Uint8Array(123/*\'z\'+1*/);\n  for (var i = 25; i >= 0; --i) {\n    base64ReverseLookup[48+i] = 52+i; // \'0-9\'\n    base64ReverseLookup[65+i] = i; // \'A-Z\'\n    base64ReverseLookup[97+i] = 26+i; // \'a-z\'\n  }\n  base64ReverseLookup[43] = 62; // \'+\'\n  base64ReverseLookup[47] = 63; // \'/\'\n  /** @noinline Inlining this function would mean expanding the base64 string 4x times in the source code, which Closure seems to be happy to do. */\n  function base64DecodeToExistingUint8Array(uint8Array, offset, b64) {\n    var b1, b2, i = 0, j = offset, bLength = b64.length, end = offset + (bLength*3>>2) - (b64[bLength-2] == \'=\') - (b64[bLength-1] == \'=\');\n    for (; i < bLength; i += 4) {\n      b1 = base64ReverseLookup[b64.charCodeAt(i+1)];\n      b2 = base64ReverseLookup[b64.charCodeAt(i+2)];\n      uint8Array[j++] = base64ReverseLookup[b64.charCodeAt(i)] << 2 | b1 >> 4;\n      if (j < end) uint8Array[j++] = b1 << 4 | b2 >> 2;\n      if (j < end) uint8Array[j++] = b2 << 6 | base64ReverseLookup[b64.charCodeAt(i+3)];\n    }"
                   );
    if (((local_38->wasm->features).features & 0x10) != 0) {
      std::operator<<(&local_38->out->out,"\n    return uint8Array;");
    }
    std::operator<<(&local_38->out->out,"\n  }\n");
    uVar10 = 0;
    pWVar8 = local_38;
    while( true ) {
      uVar9 = (ulong)uVar10;
      wasm = pWVar8->wasm;
      puVar5 = (wasm->dataSegments).
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(wasm->dataSegments).
                        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3) <= uVar9)
      break;
      if (*(char *)((long)puVar5[uVar9]._M_t.
                          super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                          ._M_t + 0x28) == '\x01') {
        poVar6 = std::operator<<(&pWVar8->out->out,"memorySegments[");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6,"] = base64DecodeToExistingUint8Array(new Uint8Array(");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6,")");
        poVar6 = std::operator<<(poVar6,", 0, \"");
        base64Encode_abi_cxx11_
                  ((string *)&local_298,
                   (vector<char,_std::allocator<char>_> *)
                   ((long)puVar5[uVar9]._M_t.
                          super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                          ._M_t + 0x38));
        poVar6 = std::operator<<(poVar6,(string *)&local_298);
        std::operator<<(poVar6,"\");\n");
        std::__cxx11::string::~string((string *)&local_298);
        pWVar8 = local_38;
      }
      uVar10 = uVar10 + 1;
    }
    bVar4 = hasActiveSegments(wasm);
    if (bVar4) {
      std::operator<<(&local_38->out->out,"function initActiveSegments(imports) {\n");
      uVar10 = 0;
      pWVar8 = local_38;
      while( true ) {
        uVar9 = (ulong)uVar10;
        puVar5 = (pWVar8->wasm->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pWVar8->wasm->dataSegments).
                          super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3) <= uVar9)
        break;
        if (*(char *)((long)puVar5[uVar9]._M_t.
                            super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                     + 0x28) == '\0') {
          local_50 = std::operator<<(&pWVar8->out->out,
                                     "  base64DecodeToExistingUint8Array(bufferView, ");
          pcVar2 = *(char **)((long)puVar5[uVar9]._M_t.
                                    super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                             + 0x30);
          if (*pcVar2 == '\n') {
            pGVar7 = Module::getGlobal(pWVar8->wasm,(Name)((IString *)(pcVar2 + 0x10))->str);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f0,"imports[\'",&local_39);
            local_48 = pGVar7;
            IString::toString_abi_cxx11_(&local_d0,&(pGVar7->super_Importable).module.super_IString)
            ;
            std::operator+(&local_110,&local_f0,&local_d0);
            std::operator+(&local_90,&local_110,"\'][\'");
            IString::toString_abi_cxx11_(&local_b0,&(local_48->super_Importable).base.super_IString)
            ;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_298,&local_90,&local_b0);
            std::operator+(&local_70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_298,"\']");
            std::__cxx11::string::~string((string *)&local_298);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_f0);
          }
          else {
            if (*pcVar2 != '\x0e') {
              Fatal::Fatal(&local_298);
              Fatal::operator<<(&local_298,
                                (char (*) [43])"non-constant offsets aren\'t supported yet\n");
              Fatal::~Fatal(&local_298);
            }
            __val = Literal::getInteger((Literal *)(pcVar2 + 0x10));
            std::__cxx11::to_string(&local_70,__val);
          }
          poVar6 = std::operator<<(local_50,(string *)&local_70);
          poVar6 = std::operator<<(poVar6,", \"");
          base64Encode_abi_cxx11_
                    ((string *)&local_298,
                     (vector<char,_std::allocator<char>_> *)
                     ((long)puVar5[uVar9]._M_t.
                            super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                     + 0x38));
          poVar6 = std::operator<<(poVar6,(string *)&local_298);
          std::operator<<(poVar6,"\");\n");
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&local_70);
          pWVar8 = local_38;
        }
        uVar10 = uVar10 + 1;
      }
      std::operator<<(&pWVar8->out->out,"}\n");
    }
  }
  return;
}

Assistant:

void Wasm2JSGlue::emitMemory() {
  if (needsBufferView(wasm)) {
    // Create a helper bufferView to access the buffer if we need one. We use it
    // for creating memory segments if we have any (we may not if the segments
    // are shipped in a side .mem file, for example), and also in bulk memory
    // operations.
    // This will get assigned during `asmFunc` (and potentially re-assigned
    // during __wasm_memory_grow).
    // TODO: We should probably just share a single HEAPU8 var.
    out << "  var bufferView;\n";
  }

  // If there are no memory segments, we don't need to emit any support code for
  // segment creation.
  if (wasm.dataSegments.empty()) {
    return;
  }

  // If we have passive memory segments, we need to store those.
  for (auto& seg : wasm.dataSegments) {
    if (seg->isPassive) {
      out << "  var memorySegments = {};\n";
      break;
    }
  }

  out <<
    R"(  var base64ReverseLookup = new Uint8Array(123/*'z'+1*/);
  for (var i = 25; i >= 0; --i) {
    base64ReverseLookup[48+i] = 52+i; // '0-9'
    base64ReverseLookup[65+i] = i; // 'A-Z'
    base64ReverseLookup[97+i] = 26+i; // 'a-z'
  }
  base64ReverseLookup[43] = 62; // '+'
  base64ReverseLookup[47] = 63; // '/'
  /** @noinline Inlining this function would mean expanding the base64 string 4x times in the source code, which Closure seems to be happy to do. */
  function base64DecodeToExistingUint8Array(uint8Array, offset, b64) {
    var b1, b2, i = 0, j = offset, bLength = b64.length, end = offset + (bLength*3>>2) - (b64[bLength-2] == '=') - (b64[bLength-1] == '=');
    for (; i < bLength; i += 4) {
      b1 = base64ReverseLookup[b64.charCodeAt(i+1)];
      b2 = base64ReverseLookup[b64.charCodeAt(i+2)];
      uint8Array[j++] = base64ReverseLookup[b64.charCodeAt(i)] << 2 | b1 >> 4;
      if (j < end) uint8Array[j++] = b1 << 4 | b2 >> 2;
      if (j < end) uint8Array[j++] = b2 << 6 | base64ReverseLookup[b64.charCodeAt(i+3)];
    })";
  if (wasm.features.hasBulkMemory()) {
    // Passive segments in bulk memory are initialized into new arrays that are
    // passed into here, and we need to return them.
    out << R"(
    return uint8Array;)";
  }
  out << R"(
  }
)";

  for (Index i = 0; i < wasm.dataSegments.size(); i++) {
    auto& seg = wasm.dataSegments[i];
    if (seg->isPassive) {
      // Fancy passive segments are decoded into typed arrays on the side, for
      // later copying.
      out << "memorySegments[" << i
          << "] = base64DecodeToExistingUint8Array(new Uint8Array("
          << seg->data.size() << ")"
          << ", 0, \"" << base64Encode(seg->data) << "\");\n";
    }
  }

  if (hasActiveSegments(wasm)) {
    auto globalOffset = [&](const DataSegment& segment) {
      if (auto* c = segment.offset->dynCast<Const>()) {
        return std::to_string(c->value.getInteger());
      }
      if (auto* get = segment.offset->dynCast<GlobalGet>()) {
        auto internalName = get->name;
        auto importedGlobal = wasm.getGlobal(internalName);
        return std::string("imports['") + importedGlobal->module.toString() +
               "']['" + importedGlobal->base.toString() + "']";
      }
      Fatal() << "non-constant offsets aren't supported yet\n";
    };

    out << "function initActiveSegments(imports) {\n";
    for (Index i = 0; i < wasm.dataSegments.size(); i++) {
      auto& seg = wasm.dataSegments[i];
      if (!seg->isPassive) {
        // Plain active segments are decoded directly into the main memory.
        out << "  base64DecodeToExistingUint8Array(bufferView, "
            << globalOffset(*seg) << ", \"" << base64Encode(seg->data)
            << "\");\n";
      }
    }
    out << "}\n";
  }
}